

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O1

void __thiscall
cfd::core::Address::Address
          (Address *this,NetType_conflict type,WitnessVersion witness_ver,Script *script,
          AddressFormatData *network_parameter)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  NetType_conflict NVar2;
  AddressType local_94;
  SchnorrPubkey *local_90;
  Pubkey *local_88;
  ByteData *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  string *local_70;
  string local_68;
  CfdSourceLocation local_48;
  
  this->type_ = type;
  this->addr_type_ = kP2wshAddress;
  this->witness_ver_ = witness_ver;
  paVar1 = &(this->address_).field_2;
  (this->address_)._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&this->address_,"");
  local_78 = paVar1;
  local_70 = &this->address_;
  ByteData::ByteData(&this->hash_);
  local_88 = &this->pubkey_;
  local_80 = &this->hash_;
  Pubkey::Pubkey(local_88);
  local_90 = &this->schnorr_pubkey_;
  SchnorrPubkey::SchnorrPubkey(local_90);
  TaprootScriptTree::TaprootScriptTree(&this->script_tree_);
  Script::Script(&this->redeem_script_,script);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&this->format_data_,
             (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)network_parameter);
  this->checksum_[0] = '\0';
  this->checksum_[1] = '\0';
  this->checksum_[2] = '\0';
  this->checksum_[3] = '\0';
  NVar2 = AddressFormatData::GetNetType(&this->format_data_);
  this->type_ = NVar2;
  AddressFormatData::GetBech32Hrp_abi_cxx11_(&local_68,network_parameter);
  CalculateP2WSH(this,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  local_48.filename = "cfdcore_address.cpp";
  local_48.line = 0x1ff;
  local_48.funcname = "Address";
  local_94 = kP2wshAddress;
  AddressFormatData::GetBech32Hrp_abi_cxx11_(&local_68,network_parameter);
  logger::log<cfd::core::NetType&,cfd::core::AddressType&,std::__cxx11::string&>
            (&local_48,kCfdLogLevelInfo,"call Address({},{},{})",&this->type_,&local_94,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return;
}

Assistant:

Address::Address(
    NetType type, WitnessVersion witness_ver, const Script& script,
    const AddressFormatData& network_parameter)
    : type_(type),
      addr_type_(AddressType::kP2wshAddress),
      witness_ver_(witness_ver),
      address_(""),
      hash_(),
      pubkey_(),
      schnorr_pubkey_(),
      redeem_script_(script),
      format_data_(network_parameter) {
  memset(checksum_, 0, sizeof(checksum_));
  SetNetType(format_data_);
  CalculateP2WSH(network_parameter.GetBech32Hrp());
  info(
      CFD_LOG_SOURCE, "call Address({},{},{})", type_,
      AddressType::kP2wshAddress, network_parameter.GetBech32Hrp());
}